

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

float plutovg_canvas_text_extents
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                plutovg_rect_t *extents)

{
  plutovg_state_t *ppVar1;
  plutovg_state_t *state;
  plutovg_rect_t *extents_local;
  plutovg_text_encoding_t encoding_local;
  int length_local;
  void *text_local;
  plutovg_canvas_t *canvas_local;
  
  ppVar1 = canvas->state;
  if ((ppVar1->font_face == (plutovg_font_face_t *)0x0) || (ppVar1->font_size <= 0.0)) {
    if (extents != (plutovg_rect_t *)0x0) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
    canvas_local._4_4_ = 0.0;
  }
  else {
    canvas_local._4_4_ =
         plutovg_font_face_text_extents
                   (ppVar1->font_face,ppVar1->font_size,text,length,encoding,extents);
  }
  return canvas_local._4_4_;
}

Assistant:

float plutovg_canvas_text_extents(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        return plutovg_font_face_text_extents(state->font_face, state->font_size, text, length, encoding, extents);
    }

    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }

    return 0.f;
}